

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O2

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType&,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>&>
          (BuilderContext *this,shared_ptr<mocker::ir::Reg> *args,OpType *args_1,
          shared_ptr<mocker::ir::Reg> *args_2,shared_ptr<mocker::ir::IntLiteral> *args_3)

{
  shared_ptr<mocker::ir::ArithBinaryInst> inst;
  shared_ptr<mocker::ir::IRInst> local_38;
  shared_ptr<mocker::ir::Reg> local_28;
  
  std::
  make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType&,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>&>
            (&local_28,(OpType *)args,(shared_ptr<mocker::ir::Reg> *)args_1,
             (shared_ptr<mocker::ir::IntLiteral> *)args_2);
  local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  appendInst(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }